

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

int flatcc_json_printer_struct_as_root
              (flatcc_json_printer_t *ctx,void *buf,size_t bufsiz,char *fid,
              flatcc_json_printer_struct_f *pf)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  int local_4c;
  flatcc_json_printer_struct_f *pf_local;
  char *fid_local;
  size_t bufsiz_local;
  void *buf_local;
  flatcc_json_printer_t *ctx_local;
  
  iVar2 = accept_header(ctx,buf,bufsiz,fid);
  if (iVar2 == 0) {
    ctx_local._4_4_ = -1;
  }
  else {
    ctx->level = ctx->level + 1;
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '{';
    pvVar3 = read_uoffset_ptr(buf);
    (*pf)(ctx,pvVar3);
    if (ctx->indent != '\0') {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '}';
    if ((ctx->indent != '\0') && (ctx->level == 0)) {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
    }
    (*ctx->flush)(ctx,1);
    iVar2 = flatcc_json_printer_get_error(ctx);
    if (iVar2 == 0) {
      local_4c = (int)ctx->total + ((int)ctx->p - (int)ctx->buf);
    }
    else {
      local_4c = -1;
    }
    ctx_local._4_4_ = local_4c;
  }
  return ctx_local._4_4_;
}

Assistant:

int flatcc_json_printer_struct_as_root(flatcc_json_printer_t *ctx,
        const void *buf, size_t bufsiz, const char *fid,
        flatcc_json_printer_struct_f *pf)
{
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return -1;
    }
    print_start('{');
    pf(ctx, read_uoffset_ptr(buf));
    print_end('}');
    print_last_nl();
    return flatcc_json_printer_get_error(ctx) ? -1 : (int)ctx->total + (int)(ctx->p - ctx->buf);
}